

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmctest.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  long *plVar6;
  size_t sVar7;
  long lVar8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *__lhs;
  int *__ptr;
  int *__ptr_00;
  int *__ptr_01;
  void *__ptr_02;
  reference pvVar9;
  double *pdVar10;
  void *__ptr_03;
  void *__ptr_04;
  ostream *poVar11;
  void *__ptr_05;
  reference pdVar12;
  void *__ptr_06;
  void *__ptr_07;
  void *__ptr_08;
  void *__ptr_09;
  void *__ptr_10;
  void *__ptr_11;
  void *__ptr_12;
  void *__ptr_13;
  uint uVar13;
  bool bVar14;
  undefined1 auVar15 [64];
  undefined4 in_stack_fffffffffffff5cc;
  allocator_type *__a;
  allocator_type *__a_00;
  size_type in_stack_fffffffffffff5e8;
  vector<double,_std::allocator<double>_> *this;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff5f0;
  value_type vVar16;
  undefined8 in_stack_fffffffffffff608;
  int repeats;
  char *in_stack_fffffffffffff610;
  int local_804;
  double dStack_800;
  int i_8;
  double total;
  undefined1 local_7e8 [8];
  vector<double,_std::allocator<double>_> element;
  double dStack_7c8;
  int k_1;
  double sum;
  int i_7;
  int i_6;
  int cumulativeScalingIndices [4];
  undefined1 local_7a0 [8];
  vector<double,_std::allocator<double>_> sumBuffer;
  undefined1 local_780 [8];
  vector<double,_std::allocator<double>_> firstBuffer;
  int j_2;
  int k;
  int s_1;
  int l;
  int preBufferIndex;
  int postBufferIndex;
  int m;
  int i_5;
  double *grand_numerator;
  double *grand_denominator;
  double *tmpNumerator;
  double *seepostPartials;
  double *seeprePartials;
  double *diagonalHessian;
  double *gradient;
  undefined8 uStack_708;
  int categoryRatesIndex;
  int cumulativeScalingInices [4];
  int secondDervIndices [4];
  int firstDervIndices [4];
  int preBufferIndices [4];
  int postBufferIndices [4];
  int s;
  int p;
  int c;
  int offset;
  double *seerootPartials;
  double logLike;
  iterator __end1;
  iterator __begin1;
  vector<double,_std::allocator<double>_> *__range1;
  vector<double,_std::allocator<double>_> siteLogLikelihoods;
  double logL;
  int scalingFactorsIndices [2];
  int scalingFactorsCount;
  int cumulativeScalingIndex;
  double *patternLogLik;
  undefined4 local_638;
  int rootPreIndex;
  BeagleOperation pre_order_operations [4];
  int transpose;
  int stateFrequencyIndex;
  int categoryWeightsIndex;
  int rootIndex;
  BeagleOperation operations [2];
  int local_578;
  int local_574;
  int j_1;
  int i_4;
  int r_1;
  int offset_2;
  int j;
  int i_3;
  int r;
  int offset_1;
  double *mat;
  int nodeId;
  double *matrix2;
  double *matrix1;
  int transposeIndices [6];
  undefined8 uStack_518;
  int originalIndices [6];
  undefined8 uStack_4f8;
  double edgeLengths [4];
  int nodeIndices [4];
  int local_4bc;
  int local_4b8;
  int entry;
  int rate;
  vector<double,_std::allocator<double>_> scaledQ2;
  undefined1 local_480 [8];
  vector<double,_std::allocator<double>_> scaledQ;
  double Q2 [32];
  double Q [32];
  double eval [8];
  double ivec [16];
  double evec [16];
  int i_2;
  unsigned_long __vla_expr1;
  double freqs [4];
  int i_1;
  double *patternWeights;
  unsigned_long __vla_expr0;
  double *gorillaPartials;
  double *chimpPartials;
  double *humanPartials;
  int *gorillaStates;
  int *chimpStates;
  int *humanStates;
  int rNumber;
  int instance;
  long requirementFlags;
  long preferenceFlags;
  BeagleInstanceDetails instDetails;
  int whichDevice;
  bool useTipStates;
  bool useGpu;
  int scaleCount;
  int rateCategoryCount;
  int nPatterns;
  int nRepeats;
  int stateCount;
  bool useSSE;
  bool singlePrecision;
  bool doJC;
  bool scaling;
  int i;
  BeagleResourceList *rList;
  char **argv_local;
  int argc_local;
  
  plVar6 = (long *)beagleGetResourceList();
  fprintf(_stdout,"Available resources:\n");
  for (stateCount = 0; repeats = (int)((ulong)in_stack_fffffffffffff608 >> 0x20),
      stateCount < (int)plVar6[1]; stateCount = stateCount + 1) {
    fprintf(_stdout,"\tResource %i:\n\t\tName : %s\n",(ulong)(uint)stateCount,
            *(undefined8 *)(*plVar6 + (long)stateCount * 0x20));
    fprintf(_stdout,"\t\tDesc : %s\n",*(undefined8 *)(*plVar6 + (long)stateCount * 0x20 + 8));
    fprintf(_stdout,"\t\tFlags:");
    printFlags(0x103d89);
    fprintf(_stdout,"\n");
  }
  fprintf(_stdout,"\n");
  sVar7 = strlen(human);
  iVar4 = (int)sVar7;
  bVar14 = false;
  if (1 < argc) {
    iVar5 = strcmp(argv[1],"--gpu");
    bVar14 = iVar5 == 0;
  }
  instDetails.flags._4_4_ = -1;
  if ((bVar14) && (2 < argc)) {
    lVar8 = atol(argv[2]);
    instDetails.flags._4_4_ = (int)lVar8;
    if (instDetails.flags._4_4_ < 0) {
      instDetails.flags._4_4_ = -1;
    }
  }
  if (bVar14) {
    requirementFlags = 0x10200;
  }
  else {
    requirementFlags = 0x8200;
  }
  __lhs = (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
          (requirementFlags | 2);
  uVar13 = (uint)(-1 < instDetails.flags._4_4_);
  __a = (allocator_type *)0x810;
  iVar5 = beagleCreateInstance(3,10,3,4,iVar4,1,0xc,1,0);
  if (iVar5 < 0) {
    fprintf(_stderr,"Failed to obtain BEAGLE instance\n\n");
    exit(1);
  }
  fprintf(_stdout,"Using resource %i:\n",(ulong)(uint)preferenceFlags);
  fprintf(_stdout,"\tRsrc Name : %s\n",instDetails._0_8_);
  fprintf(_stdout,"\tImpl Name : %s\n",instDetails.resourceName);
  fprintf(_stdout,"\tImpl Desc : %s\n",instDetails.implName);
  fprintf(_stdout,"\n");
  __ptr = getStates(in_stack_fffffffffffff610,repeats);
  __ptr_00 = getStates(in_stack_fffffffffffff610,repeats);
  __ptr_01 = getStates(in_stack_fffffffffffff610,repeats);
  beagleSetTipStates(iVar5,0,__ptr);
  beagleSetTipStates(iVar5,1,__ptr_00);
  beagleSetTipStates(iVar5,2,__ptr_01);
  free(__ptr);
  free(__ptr_00);
  __a_00 = (allocator_type *)0x10418d;
  free(__ptr_01);
  beagleSetCategoryRates(iVar5);
  __ptr_02 = malloc((long)iVar4 << 3);
  for (freqs[3]._4_4_ = 0; freqs[3]._4_4_ < iVar4; freqs[3]._4_4_ = freqs[3]._4_4_ + 1) {
    *(undefined8 *)((long)__ptr_02 + (long)freqs[3]._4_4_ * 8) = 0x3ff0000000000000;
  }
  beagleSetPatternWeights(iVar5,__ptr_02);
  __vla_expr1 = 0x3fb999999999999a;
  freqs[0] = 0.3;
  freqs[1] = 0.2;
  freqs[2] = 0.4;
  beagleSetStateFrequencies(iVar5,0,&__vla_expr1);
  for (evec[0xf]._4_4_ = 0; evec[0xf]._4_4_ < 1; evec[0xf]._4_4_ = evec[0xf]._4_4_ + 1) {
    *(undefined8 *)(&stack0xfffffffffffff5c8 + (long)evec[0xf]._4_4_ * 8) = 0x3ff0000000000000;
  }
  beagleSetCategoryWeights(iVar5,0,&stack0xfffffffffffff5c8);
  auVar15 = vmovdqu64_avx512f(_DAT_001070f0);
  vmovdqu64_avx512f(auVar15);
  auVar15 = vmovdqu64_avx512f(_DAT_001070b0);
  unique0x00006d80 = vmovdqu64_avx512f(auVar15);
  auVar15 = vmovdqu64_avx512f(_DAT_00107170);
  auVar15 = vmovdqu64_avx512f(auVar15);
  ivec[7] = (double)auVar15._0_8_;
  ivec[8] = (double)auVar15._8_8_;
  ivec[9] = (double)auVar15._16_8_;
  ivec[10] = (double)auVar15._24_8_;
  ivec[0xb] = (double)auVar15._32_8_;
  ivec[0xc] = (double)auVar15._40_8_;
  ivec[0xd] = (double)auVar15._48_8_;
  ivec[0xe] = (double)auVar15._56_8_;
  auVar15 = vmovdqu64_avx512f(_DAT_00107130);
  unique0x00006d80 = vmovdqu64_avx512f(auVar15);
  auVar15 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  eval[0] = -1.4285709560771915;
  Q[0x1f] = -1.4285710561809946;
  eval._16_40_ = auVar15._24_40_;
  eval[1] = -1.4285708722142385;
  auVar15 = vmovdqu64_avx512f(_DAT_00107270);
  auVar15 = vmovdqu64_avx512f(auVar15);
  Q[0x17] = (double)auVar15._0_8_;
  Q[0x18] = (double)auVar15._8_8_;
  Q[0x19] = (double)auVar15._16_8_;
  Q[0x1a] = (double)auVar15._24_8_;
  Q[0x1b] = (double)auVar15._32_8_;
  Q[0x1c] = (double)auVar15._40_8_;
  Q[0x1d] = (double)auVar15._48_8_;
  Q[0x1e] = (double)auVar15._56_8_;
  auVar15 = vmovdqu64_avx512f(_DAT_00107230);
  auVar15 = vmovdqu64_avx512f(auVar15);
  Q[0xf] = (double)auVar15._0_8_;
  Q[0x10] = (double)auVar15._8_8_;
  Q[0x11] = (double)auVar15._16_8_;
  Q[0x12] = (double)auVar15._24_8_;
  Q[0x13] = (double)auVar15._32_8_;
  Q[0x14] = (double)auVar15._40_8_;
  Q[0x15] = (double)auVar15._48_8_;
  Q[0x16] = (double)auVar15._56_8_;
  auVar15 = vmovdqu64_avx512f(_DAT_001071f0);
  auVar15 = vmovdqu64_avx512f(auVar15);
  Q[7] = (double)auVar15._0_8_;
  Q[8] = (double)auVar15._8_8_;
  Q[9] = (double)auVar15._16_8_;
  Q[10] = (double)auVar15._24_8_;
  Q[0xb] = (double)auVar15._32_8_;
  Q[0xc] = (double)auVar15._40_8_;
  Q[0xd] = (double)auVar15._48_8_;
  Q[0xe] = (double)auVar15._56_8_;
  auVar15 = vmovdqu64_avx512f(_DAT_001071b0);
  unique0x00006d80 = vmovdqu64_avx512f(auVar15);
  auVar15 = vmovdqu64_avx512f(_DAT_00107370);
  auVar15 = vmovdqu64_avx512f(auVar15);
  Q2[0x17] = (double)auVar15._0_8_;
  Q2[0x18] = (double)auVar15._8_8_;
  Q2[0x19] = (double)auVar15._16_8_;
  Q2[0x1a] = (double)auVar15._24_8_;
  Q2[0x1b] = (double)auVar15._32_8_;
  Q2[0x1c] = (double)auVar15._40_8_;
  Q2[0x1d] = (double)auVar15._48_8_;
  Q2[0x1e] = (double)auVar15._56_8_;
  auVar15 = vmovdqu64_avx512f(_DAT_00107330);
  auVar15 = vmovdqu64_avx512f(auVar15);
  Q2[0xf] = (double)auVar15._0_8_;
  Q2[0x10] = (double)auVar15._8_8_;
  Q2[0x11] = (double)auVar15._16_8_;
  Q2[0x12] = (double)auVar15._24_8_;
  Q2[0x13] = (double)auVar15._32_8_;
  Q2[0x14] = (double)auVar15._40_8_;
  Q2[0x15] = (double)auVar15._48_8_;
  Q2[0x16] = (double)auVar15._56_8_;
  auVar15 = vmovdqu64_avx512f(_DAT_001072f0);
  auVar15 = vmovdqu64_avx512f(auVar15);
  Q2[7] = (double)auVar15._0_8_;
  Q2[8] = (double)auVar15._8_8_;
  Q2[9] = (double)auVar15._16_8_;
  Q2[10] = (double)auVar15._24_8_;
  Q2[0xb] = (double)auVar15._32_8_;
  Q2[0xc] = (double)auVar15._40_8_;
  Q2[0xd] = (double)auVar15._48_8_;
  Q2[0xe] = (double)auVar15._56_8_;
  auVar15 = vmovdqu64_avx512f(_DAT_001072b0);
  unique0x00006d80 = vmovdqu64_avx512f(auVar15);
  std::allocator<double>::allocator((allocator<double> *)0x1044da);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,__a_00);
  std::allocator<double>::~allocator((allocator<double> *)0x104500);
  std::allocator<double>::allocator((allocator<double> *)0x104513);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,__a_00);
  std::allocator<double>::~allocator((allocator<double> *)0x104539);
  for (local_4b8 = 0; local_4b8 < 1; local_4b8 = local_4b8 + 1) {
    for (local_4bc = 0; local_4bc < 0x10; local_4bc = local_4bc + 1) {
      dVar1 = Q2[(long)(local_4bc + local_4b8 * 0x10) + 0x1f];
      dVar2 = *(double *)(&stack0xfffffffffffff5d8 + (long)local_4b8 * 8);
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_480,
                          (long)(local_4bc + local_4b8 * 0x10));
      *pvVar9 = dVar1 * dVar2;
      dVar1 = Q2[(long)(local_4bc + local_4b8 * 0x10) + -1];
      dVar2 = *(double *)(&stack0xfffffffffffff5d8 + (long)local_4b8 * 8);
      dVar3 = *(double *)(&stack0xfffffffffffff5d8 + (long)local_4b8 * 8);
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)&rate,
                          (long)(local_4bc + local_4b8 * 0x10));
      *pvVar9 = dVar1 * dVar2 * dVar3;
    }
  }
  beagleSetEigenDecomposition(iVar5,0,ivec + 0xf,eval + 7,Q + 0x1f);
  edgeLengths[3] = 2.12199579096527e-314;
  uStack_4f8 = 0x3ff0000000000000;
  edgeLengths[0] = 1.0;
  edgeLengths[1] = 1.0;
  edgeLengths[2] = 1.0;
  beagleUpdateTransitionMatrices(iVar5,0,edgeLengths + 3,0,0,&uStack_4f8);
  pdVar10 = std::vector<double,_std::allocator<double>_>::data
                      ((vector<double,_std::allocator<double>_> *)0x10475f);
  beagleSetTransitionMatrix(0,iVar5,4,pdVar10);
  pdVar10 = std::vector<double,_std::allocator<double>_>::data
                      ((vector<double,_std::allocator<double>_> *)0x104790);
  beagleSetTransitionMatrix(0,iVar5,5,pdVar10);
  uStack_518 = 0x100000000;
  originalIndices[0] = 2;
  originalIndices[1] = 3;
  originalIndices[2] = 4;
  originalIndices[3] = 5;
  transposeIndices[2] = 10;
  transposeIndices[3] = 0xb;
  matrix1 = (double *)0x700000006;
  transposeIndices[0] = 8;
  transposeIndices[1] = 9;
  beagleTransposeTransitionMatrices(iVar5,&uStack_518,&matrix1,6);
  __ptr_03 = malloc(0x80);
  __ptr_04 = malloc(0x80);
  beagleGetTransitionMatrix(iVar5,0,__ptr_03);
  beagleGetTransitionMatrix(iVar5,6,__ptr_04);
  poVar11 = std::operator<<((ostream *)&std::cout,"Matrix for node ");
  poVar11 = (ostream *)std::ostream::operator<<(poVar11,0);
  std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
  i_3 = 0;
  for (j = 0; j < 1; j = j + 1) {
    poVar11 = std::operator<<((ostream *)&std::cout,"  rate category");
    poVar11 = (ostream *)std::ostream::operator<<(poVar11,j + 1);
    std::operator<<(poVar11,": \n");
    for (offset_2 = 0; offset_2 < 4; offset_2 = offset_2 + 1) {
      for (r_1 = 0; r_1 < 4; r_1 = r_1 + 1) {
        lVar8 = (long)i_3;
        i_3 = i_3 + 1;
        poVar11 = (ostream *)
                  std::ostream::operator<<
                            ((ostream *)&std::cout,*(double *)((long)__ptr_03 + lVar8 * 8));
        std::operator<<(poVar11,", ");
      }
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  }
  poVar11 = std::operator<<((ostream *)&std::cout,"Matrix-transpose for node ");
  poVar11 = (ostream *)std::ostream::operator<<(poVar11,0);
  std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
  i_4 = 0;
  for (j_1 = 0; j_1 < 1; j_1 = j_1 + 1) {
    poVar11 = std::operator<<((ostream *)&std::cout,"  rate category");
    poVar11 = (ostream *)std::ostream::operator<<(poVar11,j_1 + 1);
    std::operator<<(poVar11,": \n");
    for (local_574 = 0; local_574 < 4; local_574 = local_574 + 1) {
      for (local_578 = 0; local_578 < 4; local_578 = local_578 + 1) {
        lVar8 = (long)i_4;
        i_4 = i_4 + 1;
        poVar11 = (ostream *)
                  std::ostream::operator<<
                            ((ostream *)&std::cout,*(double *)((long)__ptr_04 + lVar8 * 8));
        std::operator<<(poVar11,", ");
      }
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  }
  categoryWeightsIndex = 3;
  rootIndex = -1;
  operations[0].destinationPartials = -1;
  operations[0].destinationScaleWrite = 0;
  operations[0].destinationScaleRead = 0;
  operations[0].child1Partials = 1;
  operations[0].child1TransitionMatrix = 1;
  operations[0].child2Partials = 4;
  operations[0].child2TransitionMatrix = -1;
  operations[1].destinationPartials = -1;
  operations[1].destinationScaleWrite = 2;
  operations[1].destinationScaleRead = 2;
  operations[1].child1Partials = 3;
  operations[1].child1TransitionMatrix = 3;
  stateFrequencyIndex = 4;
  beagleUpdatePartials(iVar5,&categoryWeightsIndex,2);
  transpose = 0;
  pre_order_operations[3].child2TransitionMatrix = 0;
  pre_order_operations[3].destinationScaleRead = 0;
  local_638 = 6;
  rootPreIndex = -1;
  pre_order_operations[0].destinationPartials = -1;
  pre_order_operations[0].destinationScaleWrite = 5;
  pre_order_operations[0].destinationScaleRead = 3;
  pre_order_operations[0].child1Partials = 2;
  pre_order_operations[0].child1TransitionMatrix = 2;
  pre_order_operations[0].child2Partials = 7;
  pre_order_operations[0].child2TransitionMatrix = -1;
  pre_order_operations[1].destinationPartials = -1;
  pre_order_operations[1].destinationScaleWrite = 5;
  pre_order_operations[1].destinationScaleRead = 2;
  pre_order_operations[1].child1Partials = 3;
  pre_order_operations[1].child1TransitionMatrix = 3;
  pre_order_operations[1].child2Partials = 8;
  pre_order_operations[1].child2TransitionMatrix = -1;
  pre_order_operations[2].destinationPartials = -1;
  pre_order_operations[2].destinationScaleWrite = 6;
  pre_order_operations[2].destinationScaleRead = 1;
  pre_order_operations[2].child1Partials = 0;
  pre_order_operations[2].child1TransitionMatrix = 0;
  pre_order_operations[2].child2Partials = 9;
  pre_order_operations[2].child2TransitionMatrix = -1;
  pre_order_operations[3].destinationPartials = -1;
  pre_order_operations[3].destinationScaleWrite = 6;
  pre_order_operations[3].child1Partials = 1;
  pre_order_operations[3].child1TransitionMatrix = 1;
  pre_order_operations[3].child2Partials = pre_order_operations[3].destinationScaleRead;
  __ptr_05 = malloc((long)iVar4 << 3);
  scalingFactorsIndices[1] = -1;
  beagleCalculateRootLogLikelihoods
            (iVar5,&stateFrequencyIndex,&transpose,&pre_order_operations[3].child2TransitionMatrix,
             scalingFactorsIndices + 1,1);
  std::allocator<double>::allocator((allocator<double> *)0x104f56);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,__a_00);
  std::allocator<double>::~allocator((allocator<double> *)0x104f7e);
  pdVar10 = std::vector<double,_std::allocator<double>_>::data
                      ((vector<double,_std::allocator<double>_> *)0x104f96);
  beagleGetSiteLogLikelihoods(iVar5,pdVar10);
  std::operator<<((ostream *)&std::cout,"site-log-like:");
  __end1 = std::vector<double,_std::allocator<double>_>::begin
                     ((vector<double,_std::allocator<double>_> *)
                      CONCAT44(in_stack_fffffffffffff5cc,uVar13));
  std::vector<double,_std::allocator<double>_>::end
            ((vector<double,_std::allocator<double>_> *)CONCAT44(in_stack_fffffffffffff5cc,uVar13));
  while (bVar14 = __gnu_cxx::operator!=
                            (__lhs,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                    *)CONCAT44(in_stack_fffffffffffff5cc,uVar13)), bVar14) {
    pdVar12 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
              ::operator*(&__end1);
    dVar1 = *pdVar12;
    poVar11 = std::operator<<((ostream *)&std::cout," ");
    std::ostream::operator<<(poVar11,dVar1);
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&__end1);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  __ptr_06 = malloc((long)iVar4 * 0x20);
  p = 0;
  for (s = 0; s < 1; s = s + 1) {
    for (postBufferIndices[3] = 0; postBufferIndices[3] < iVar4;
        postBufferIndices[3] = postBufferIndices[3] + 1) {
      for (postBufferIndices[2] = 0; postBufferIndices[2] < 4;
          postBufferIndices[2] = postBufferIndices[2] + 1) {
        *(double *)((long)__ptr_06 + (long)p * 8) = freqs[(long)postBufferIndices[2] + -1];
        p = p + 1;
      }
    }
  }
  beagleSetPartials(iVar5,5,__ptr_06);
  fprintf(_stdout,"Setting preroot: %d\n",5);
  beagleUpdatePrePartials(iVar5,&local_638,4,0xffffffff);
  fprintf(_stdout,"logL = %.5f (R = -18.04619478977292)\n\n",0);
  preBufferIndices[2] = 1;
  preBufferIndices[3] = 0;
  firstDervIndices[2] = 8;
  firstDervIndices[3] = 9;
  preBufferIndices[0] = 7;
  preBufferIndices[1] = 6;
  secondDervIndices[2] = pre_order_operations[3].child2Partials + 4;
  secondDervIndices[3] = pre_order_operations[3].child2Partials + 4;
  firstDervIndices[0] = pre_order_operations[3].child2Partials + 4;
  firstDervIndices[1] = pre_order_operations[3].child2Partials + 4;
  cumulativeScalingInices[2] = pre_order_operations[3].child2Partials + 5;
  cumulativeScalingInices[3] = pre_order_operations[3].child2Partials + 5;
  secondDervIndices[0] = pre_order_operations[3].child2Partials + 5;
  secondDervIndices[1] = pre_order_operations[3].child2Partials + 5;
  uStack_708 = 0x500000006;
  cumulativeScalingInices[0] = 4;
  cumulativeScalingInices[1] = 3;
  gradient._4_4_ = transpose;
  __ptr_07 = malloc((long)iVar4 << 5);
  __ptr_08 = malloc((long)iVar4 << 5);
  __ptr_09 = malloc((long)iVar4 << 5);
  __ptr_10 = malloc((long)iVar4 << 5);
  __ptr_11 = malloc((long)iVar4 << 3);
  __ptr_12 = malloc((long)iVar4 << 3);
  __ptr_13 = malloc((long)iVar4 << 3);
  beagleGetPartials(iVar5,stateFrequencyIndex,0xffffffff,__ptr_06);
  for (postBufferIndex = 0; postBufferIndex < 5; postBufferIndex = postBufferIndex + 1) {
    for (preBufferIndex = 0; preBufferIndex < iVar4; preBufferIndex = preBufferIndex + 1) {
      *(undefined8 *)((long)__ptr_12 + (long)preBufferIndex * 8) = 0;
      *(undefined8 *)((long)__ptr_13 + (long)preBufferIndex * 8) = 0;
    }
    beagleGetPartials(iVar5,postBufferIndex + 5,0xffffffff,__ptr_09);
    poVar11 = std::operator<<((ostream *)&std::cout,"Pre-order Partial for node ");
    poVar11 = (ostream *)std::ostream::operator<<(poVar11,4 - postBufferIndex);
    std::operator<<(poVar11,": \n");
    k = 0;
    for (j_2 = 0; j_2 < 1; j_2 = j_2 + 1) {
      poVar11 = std::operator<<((ostream *)&std::cout,"  rate category");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,j_2 + 1);
      std::operator<<(poVar11,": \n");
      for (firstBuffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
          firstBuffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ < iVar4;
          firstBuffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ =
               firstBuffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
        for (firstBuffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
            (int)firstBuffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage < 4;
            firstBuffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._0_4_ =
                 (int)firstBuffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage + 1) {
          lVar8 = (long)k;
          k = k + 1;
          poVar11 = (ostream *)
                    std::ostream::operator<<
                              ((ostream *)&std::cout,*(double *)((long)__ptr_09 + lVar8 * 8));
          std::operator<<(poVar11,", ");
        }
        std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      }
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    }
  }
  std::allocator<double>::allocator((allocator<double> *)0x105612);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,__a_00);
  std::allocator<double>::~allocator((allocator<double> *)0x10563a);
  std::allocator<double>::allocator((allocator<double> *)0x10564d);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,__a_00);
  std::allocator<double>::~allocator((allocator<double> *)0x105673);
  std::vector<double,_std::allocator<double>_>::data
            ((vector<double,_std::allocator<double>_> *)0x10569b);
  std::vector<double,_std::allocator<double>_>::data
            ((vector<double,_std::allocator<double>_> *)0x1056ae);
  beagleCalculateEdgeDerivatives
            (iVar5,preBufferIndices + 2,firstDervIndices + 2,secondDervIndices + 2,&transpose,4);
  std::operator<<((ostream *)&std::cout,"check gradients  :");
  for (sum._4_4_ = 0; sum._4_4_ < iVar4 * 4; sum._4_4_ = sum._4_4_ + 1) {
    poVar11 = std::operator<<((ostream *)&std::cout," ");
    pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_780,(long)sum._4_4_);
    std::ostream::operator<<(poVar11,*pvVar9);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  for (sum._0_4_ = 0; sum._0_4_ < 4; sum._0_4_ = sum._0_4_ + 1) {
    dStack_7c8 = 0.0;
    for (element.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
         ._M_end_of_storage._4_4_ = 0;
        element.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ < iVar4;
        element.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ =
             element.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_780,
                          (long)(sum._0_4_ * iVar4 +
                                element.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage._4_4_));
      dStack_7c8 = *pvVar9 + dStack_7c8;
    }
    poVar11 = std::operator<<((ostream *)&std::cout,"node ");
    poVar11 = (ostream *)std::ostream::operator<<(poVar11,sum._0_4_);
    poVar11 = std::operator<<(poVar11,": ");
    poVar11 = (ostream *)std::ostream::operator<<(poVar11,dStack_7c8);
    poVar11 = std::operator<<(poVar11," ?= ");
    pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_7a0,(long)sum._0_4_);
    poVar11 = (ostream *)std::ostream::operator<<(poVar11,*pvVar9);
    std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
  }
  std::operator<<((ostream *)&std::cout,"\n\ncheck cross-products  :\n");
  std::allocator<double>::allocator((allocator<double> *)0x10598c);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,(value_type *)__a_00,__a);
  std::allocator<double>::~allocator((allocator<double> *)0x1059b9);
  pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_7e8,0x10);
  *pvVar9 = -1.0;
  pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_7e8,0);
  *pvVar9 = -1.0;
  pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_7e8,0x11);
  *pvVar9 = 1.0;
  pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_7e8,1);
  *pvVar9 = 1.0;
  pdVar10 = std::vector<double,_std::allocator<double>_>::data
                      ((vector<double,_std::allocator<double>_> *)0x105a57);
  beagleSetTransitionMatrix(0,iVar5,4,pdVar10);
  pdVar10 = std::vector<double,_std::allocator<double>_>::data
                      ((vector<double,_std::allocator<double>_> *)0x105a88);
  beagleSetTransitionMatrix(0,iVar5,5,pdVar10);
  poVar11 = std::operator<<((ostream *)&std::cout,"transpose = ");
  poVar11 = (ostream *)std::ostream::operator<<(poVar11,pre_order_operations[3].child2Partials);
  std::operator<<(poVar11,"\n");
  std::vector<double,_std::allocator<double>_>::data
            ((vector<double,_std::allocator<double>_> *)0x105b05);
  std::vector<double,_std::allocator<double>_>::data
            ((vector<double,_std::allocator<double>_> *)0x105b18);
  beagleCalculateEdgeDerivatives
            (iVar5,preBufferIndices + 2,firstDervIndices + 2,secondDervIndices + 2,&transpose,4);
  std::operator<<((ostream *)&std::cout,"sum buffer for element:");
  dStack_800 = 0.0;
  for (local_804 = 0; local_804 < 4; local_804 = local_804 + 1) {
    pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_7a0,(long)local_804);
    dStack_800 = dStack_800 + *pvVar9;
    poVar11 = std::operator<<((ostream *)&std::cout," ");
    pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_7a0,(long)local_804);
    std::ostream::operator<<(poVar11,*pvVar9);
  }
  poVar11 = std::operator<<((ostream *)&std::cout," == ");
  poVar11 = (ostream *)std::ostream::operator<<(poVar11,dStack_800);
  std::operator<<(poVar11,"\n");
  pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_780,0);
  *pvVar9 = 0.0;
  pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_780,1);
  *pvVar9 = 0.0;
  std::vector<double,_std::allocator<double>_>::data
            ((vector<double,_std::allocator<double>_> *)0x105d07);
  beagleCalculateCrossProductDerivative
            (iVar5,preBufferIndices + 2,firstDervIndices + 2,(long)&gradient + 4,&transpose,
             &uStack_4f8);
  poVar11 = std::operator<<((ostream *)&std::cout,"now: ");
  pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_780,0);
  poVar11 = (ostream *)std::ostream::operator<<(poVar11,*pvVar9);
  poVar11 = std::operator<<(poVar11," ");
  pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_780,1);
  poVar11 = (ostream *)std::ostream::operator<<(poVar11,*pvVar9);
  poVar11 = std::operator<<(poVar11," ?= ");
  this = (vector<double,_std::allocator<double>_> *)local_780;
  pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](this,1);
  vVar16 = *pvVar9;
  pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](this,0);
  poVar11 = (ostream *)std::ostream::operator<<(poVar11,vVar16 - *pvVar9);
  std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
  free(__ptr_02);
  free(__ptr_05);
  free(__ptr_10);
  free(__ptr_09);
  free(__ptr_06);
  free(__ptr_11);
  free(__ptr_12);
  free(__ptr_13);
  free(__ptr_07);
  free(__ptr_08);
  free(__ptr_03);
  free(__ptr_04);
  beagleFinalizeInstance(iVar5);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)__a_00);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)__a_00);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)__a_00);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)__a_00);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)__a_00);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)__a_00);
  return 0;
}

Assistant:

int main( int argc, const char* argv[] )
{
    // print resource list
    BeagleResourceList* rList;
    rList = beagleGetResourceList();
    fprintf(stdout, "Available resources:\n");
    for (int i = 0; i < rList->length; i++) {
        fprintf(stdout, "\tResource %i:\n\t\tName : %s\n", i, rList->list[i].name);
        fprintf(stdout, "\t\tDesc : %s\n", rList->list[i].description);
        fprintf(stdout, "\t\tFlags:");
        printFlags(rList->list[i].supportFlags);
        fprintf(stdout, "\n");
    }
    fprintf(stdout, "\n");

//    bool scaling = true;
    bool scaling = false; // disable scaling for now

    bool doJC = true;

    bool singlePrecision = false;
    bool useSSE = true;

    // is nucleotides...
    int stateCount = 4;

    int nRepeats = 1;

    // get the number of site patterns
	int nPatterns = strlen(human) * nRepeats;

    // change # rate category to 2
//    int rateCategoryCount = 4;
    int rateCategoryCount = 1;

    int scaleCount = (scaling ? 7 : 0);

    bool useGpu = argc > 1 && strcmp(argv[1] , "--gpu") == 0;

    bool useTipStates = true;

    int whichDevice = -1;
    if (useGpu) {
        if (argc > 2) {
            whichDevice = atol(argv[2]);
            if (whichDevice < 0) {
                whichDevice = -1;
            }
        }
    }

    BeagleInstanceDetails instDetails;

    long preferenceFlags = BEAGLE_FLAG_SCALERS_RAW;

    if (useGpu) {
        preferenceFlags |= BEAGLE_FLAG_PROCESSOR_GPU;
    } else {
        preferenceFlags |= BEAGLE_FLAG_PROCESSOR_CPU;
    }

    if (singlePrecision) {
        preferenceFlags |= BEAGLE_FLAG_PRECISION_SINGLE;
    } else {
        preferenceFlags |= BEAGLE_FLAG_PRECISION_DOUBLE;
    }

    long requirementFlags = BEAGLE_FLAG_EIGEN_REAL;
    if (useSSE) {
        requirementFlags |= BEAGLE_FLAG_VECTOR_SSE;
    } else {
        requirementFlags |= BEAGLE_FLAG_VECTOR_NONE;
    }

    // create an instance of the BEAGLE library
	int instance = beagleCreateInstance(
                                  3,				/**< Number of tip data elements (input) */
                                  10,	            /**< Number of partials buffers to create (input) */
                                  useTipStates ? 3 : 0,		        /**< Number of compact state representation buffers to create (input) */
                                  stateCount,		/**< Number of states in the continuous-time Markov chain (input) */
                                  nPatterns,		/**< Number of site patterns to be handled by the instance (input) */
                                  1,		        /**< Number of rate matrix eigen-decomposition buffers to allocate (input) */
                                  6 * 2,		    /**< Number of rate matrix buffers (input) */
                                  rateCategoryCount,/**< Number of rate categories (input) */
                                  scaleCount,       /**< Number of scaling buffers */
                                  whichDevice >= 0 ? &whichDevice : NULL, /**< List of potential resource on which this instance is allowed (input, NULL implies no restriction */
                                  whichDevice >= 0 ? 1 : 0,			    /**< Length of resourceList list (input) */
                                  preferenceFlags,
                                  requirementFlags, /**< Bit-flags indicating required implementation characteristics, see BeagleFlags (input) */
                                  &instDetails);
    if (instance < 0) {
	    fprintf(stderr, "Failed to obtain BEAGLE instance\n\n");
	    exit(1);
    }


    int rNumber = instDetails.resourceNumber;
    fprintf(stdout, "Using resource %i:\n", rNumber);
    fprintf(stdout, "\tRsrc Name : %s\n",instDetails.resourceName);
    fprintf(stdout, "\tImpl Name : %s\n", instDetails.implName);
    fprintf(stdout, "\tImpl Desc : %s\n", instDetails.implDescription);
    fprintf(stdout, "\n");

    if (useTipStates) {
        // set the sequences for each tip using state likelihood arrays
        int *humanStates = getStates(human, nRepeats);
        int *chimpStates = getStates(chimp, nRepeats);
        int *gorillaStates = getStates(gorilla, nRepeats);

        beagleSetTipStates(instance, 0, humanStates);
        beagleSetTipStates(instance, 1, chimpStates);
        beagleSetTipStates(instance, 2, gorillaStates);

        free(humanStates);
        free(chimpStates);
        free(gorillaStates);

    } else {
        // set the sequences for each tip using partial likelihood arrays
        double *humanPartials = getPartials(human, nRepeats);
        double *chimpPartials = getPartials(chimp, nRepeats);
        double *gorillaPartials = getPartials(gorilla, nRepeats);

        beagleSetTipPartials(instance, 0, humanPartials);
        beagleSetTipPartials(instance, 1, chimpPartials);
        beagleSetTipPartials(instance, 2, gorillaPartials);

        free(humanPartials);
        free(chimpPartials);
        free(gorillaPartials);
    }

#ifdef _WIN32
	std::vector<double> rates(rateCategoryCount);
#else
	double rates[rateCategoryCount];
#endif
//    for (int i = 0; i < rateCategoryCount; i++) {
//        rates[i] = 1.0;
////        rates[i] = 3.0 * (i + 1) / (2 * rateCategoryCount + 1);
//    }

//    rates[0] = 0.14251623900062188;
//    rates[1] = 1.857483760999378;

    rates[0] = 1.0;

	beagleSetCategoryRates(instance, &rates[0]);

	double* patternWeights = (double*) malloc(sizeof(double) * nPatterns);

    for (int i = 0; i < nPatterns; i++) {
        patternWeights[i] = 1.0;
    }

    beagleSetPatternWeights(instance, patternWeights);

    // create base frequency array
	double freqs[4] = { 0.1, 0.3, 0.2, 0.4 };
//    double freqs[4] = { 0.25, 0.25, 0.25, 0.25 };

    beagleSetStateFrequencies(instance, 0, freqs);

    // create an array containing site category weights
#ifdef _WIN32
	std::vector<double> weights(rateCategoryCount);
#else
	double weights[rateCategoryCount];
#endif
    for (int i = 0; i < rateCategoryCount; i++) {
        weights[i] = 1.0/rateCategoryCount;
//        weights[i] = 2.0 * double(i + 1)/ double(rateCategoryCount * (rateCategoryCount + 1));
    }

    beagleSetCategoryWeights(instance, 0, &weights[0]);

//#ifndef JC
//	// an eigen decomposition for the 4-state 1-step circulant infinitesimal generator
//	double evec[4 * 4] = {
//			 -0.5,  0.6906786606674509,   0.15153543380548623, 0.5,
//			  0.5, -0.15153543380548576,  0.6906786606674498,  0.5,
//			 -0.5, -0.6906786606674498,  -0.15153543380548617, 0.5,
//			  0.5,  0.15153543380548554, -0.6906786606674503,  0.5
//	};
//
//	double ivec[4 * 4] = {
//			 -0.5,  0.5, -0.5,  0.5,
//			  0.6906786606674505, -0.15153543380548617, -0.6906786606674507,   0.15153543380548645,
//			  0.15153543380548568, 0.6906786606674509,  -0.15153543380548584, -0.6906786606674509,
//			  0.5,  0.5,  0.5,  0.5
//	};
//
//	double eval[8] = { -2.0, -1.0, -1.0, 0, 0, 1, -1, 0 };
//#else
//	// an eigen decomposition for the JC69 model
//	double evec[4 * 4] = {
//        1.0,  2.0,  0.0,  0.5,
//        1.0,  -2.0,  0.5,  0.0,
//        1.0,  2.0, 0.0,  -0.5,
//        1.0,  -2.0,  -0.5,  0.0
//	};
//
//	double ivec[4 * 4] = {
//        0.25,  0.25,  0.25,  0.25,
//        0.125,  -0.125,  0.125,  -0.125,
//        0.0,  1.0,  0.0,  -1.0,
//        1.0,  0.0,  -1.0,  0.0
//	};
//
//	double eval[8] = { 0.0, -1.3333333333333333, -1.3333333333333333, -1.3333333333333333,
//			0.0, 0.0, 0.0, 0.0 };
//#endif

    ///eigen decomposition of the HKY85 model
    double evec[4 * 4] = {
            0.9819805,  0.040022305,  0.04454354,  -0.5,
            -0.1091089, -0.002488732, 0.81606029,  -0.5,
            -0.1091089, -0.896939683, -0.11849713, -0.5,
            -0.1091089,  0.440330814, -0.56393254, -0.5
    };

    double ivec[4 * 4] = {
            0.9165151, -0.3533241, -0.1573578, -0.4058332,
            0.0,  0.2702596, -0.8372848,  0.5670252,
            0.0,  0.8113638, -0.2686725, -0.5426913,
            -0.2, -0.6, -0.4, -0.8
    };

    ///array of real parts + array of imaginary parts
    double eval[8] = { -1.42857105618099456, -1.42857095607719153, -1.42857087221423851, 0.0,
                       0.0, 0.0, 0.0, 0.0 };

    ///Q^T matrix
//    double QT[4 * 4] = {
//            -1.2857138,  0.1428570,  0.1428570,  0.1428570,
//            0.4285712, -0.9999997,  0.4285714,  0.4285713,
//            0.2857142,  0.2857143, -1.1428568,  0.2857142,
//            0.5714284,  0.5714284,  0.5714284, -0.8571426
//    };

    double Q[4 * 4 * 2] = {
            -1.285714,  0.4285712,  0.2857142,  0.5714284,
            0.142857, -0.9999997,  0.2857143,  0.5714284,
            0.142857,  0.4285714, -1.1428568,  0.5714284,
            0.142857,  0.4285713,  0.2857142, -0.8571426,
            -1.285714,  0.4285712,  0.2857142,  0.5714284,
            0.142857, -0.9999997,  0.2857143,  0.5714284,
            0.142857,  0.4285714, -1.1428568,  0.5714284,
            0.142857,  0.4285713,  0.2857142, -0.8571426
    };

    double Q2[4 * 4 * 2] = {
            1.8367333, -0.6122443, -0.4081629, -0.8163261,
            -0.2040814,  1.4285705, -0.4081632, -0.8163259,
            -0.2040814, -0.6122447,  1.6326522, -0.8163261,
            -0.2040814, -0.6122446, -0.4081630,  1.2244890,
            1.8367333, -0.6122443, -0.4081629, -0.8163261,
            -0.2040814,  1.4285705, -0.4081632, -0.8163259,
            -0.2040814, -0.6122447,  1.6326522, -0.8163261,
            -0.2040814, -0.6122446, -0.4081630,  1.2244890
    };

    std::vector<double> scaledQ(4 * 4 * 2);
    std::vector<double> scaledQ2(4 * 4 * 2);
//    std::vector<double> scaledQT(4 * 4 * 2);

    for (int rate = 0; rate < rateCategoryCount; ++rate) {
        for (int entry = 0; entry < stateCount * stateCount; ++entry) {
            scaledQ[entry + rate * stateCount * stateCount] = Q[entry + rate * stateCount * stateCount] * rates[rate];
            scaledQ2[entry + rate * stateCount * stateCount] = Q2[entry + rate * stateCount * stateCount] * rates[rate] * rates[rate];
        }
    }

    // set the Eigen decomposition
    beagleSetEigenDecomposition(instance, 0, evec, ivec, eval);

    // a list of indices and edge lengths
    int nodeIndices[4] = { 0, 1, 2, 3 };
//    double edgeLengths[4] = { 0.6, 0.6, 1.3, 0.7};
    double edgeLengths[4] = { 1.0, 1.0, 1.0, 1.0};

    // tell BEAGLE to populate the transition matrices for the above edge lengths
    beagleUpdateTransitionMatrices(instance,     // instance
	                         0,             // eigenIndex
	                         nodeIndices,   // probabilityIndices
	                         NULL,          // firstDerivativeIndices
	                         NULL,          // secondDervativeIndices
	                         edgeLengths,   // edgeLengths
	                         4);            // count

    beagleSetTransitionMatrix(instance, 4, scaledQ.data(), 0.0);
    beagleSetTransitionMatrix(instance, 5, scaledQ2.data(), 0.0);

    int originalIndices[6]  = { 0, 1, 2, 3, 4, 5 };
    int transposeIndices[6] = { 6, 7, 8, 9, 10, 11 };

    beagleTransposeTransitionMatrices(instance, originalIndices, transposeIndices, 6);

    double* matrix1 = (double*) malloc(sizeof(double) * stateCount * stateCount * rateCategoryCount);
    double* matrix2 = (double*) malloc(sizeof(double) * stateCount * stateCount * rateCategoryCount);

    beagleGetTransitionMatrix(instance, 0, matrix1);
    beagleGetTransitionMatrix(instance, 6, matrix2);

    int nodeId = 0;
    std::cout << "Matrix for node " << nodeId << std::endl;
    double* mat = matrix1;
    {
        int offset = 0;
        for (int r = 0; r < rateCategoryCount; r++) {
            std::cout << "  rate category" << r + 1 << ": \n";
            for (int i = 0; i < stateCount; i++) {
                for (int j = 0; j < stateCount; j++) {
                    std::cout << mat[offset++] << ", ";
                }
                std::cout << std::endl;
            }
            std::cout << std::endl;
        }
    }

    std::cout << "Matrix-transpose for node " << nodeId << std::endl;
    mat = matrix2;
    {
        int offset = 0;
        for (int r = 0; r < rateCategoryCount; r++) {
            std::cout << "  rate category" << r + 1 << ": \n";
            for (int i = 0; i < stateCount; i++) {
                for (int j = 0; j < stateCount; j++) {
                    std::cout << mat[offset++] << ", ";
                }
                std::cout << std::endl;
            }
            std::cout << std::endl;
        }
    }

    // create a list of partial likelihood update operations
    // the order is [dest, destScaling, source1, matrix1, source2, matrix2]
	BeagleOperation operations[2] = {
		3, (scaling ? 0 : BEAGLE_OP_NONE), BEAGLE_OP_NONE, 0, 0, 1, 1,
		4, (scaling ? 1 : BEAGLE_OP_NONE), BEAGLE_OP_NONE, 2, 2, 3, 3
	};

	int rootIndex = 4;

    // update the partials
	beagleUpdatePartials(instance,      // instance
                   operations,     // eigenIndex
                   2,              // operationCount
                   BEAGLE_OP_NONE);          // cumulative scaling index

    ///XJ: I decided to store the pre-order partials vector in reverse order as those of post-orders
    ///This means that the two indices to the partials of root nodes are adjacent.
    ///For any node, the indices of the two partials sum to 2*(partialsBufferCount + compactBufferCount) - 1


    int categoryWeightsIndex = 0;
    int stateFrequencyIndex = 0;
    int transpose = (stateCount == 4 || !useGpu) ? 0 : 6;
    // create a list of partial likelihood update operations
    // the order is [dest, destScaling, source1, matrix1, source2, matrix2]
    // destPartials point to the pre-order partials
    // partials1 = pre-order partials of the parent node
    // matrices1 = Ptr matrices of the current node (to the parent node)
    // partials2 = post-order partials of the sibling node
    // matrices2 = Ptr matrices of the sibling node (to the parent node)
    BeagleOperation pre_order_operations[4] = {
            6, (scaling ? 3 : BEAGLE_OP_NONE), BEAGLE_OP_NONE, 5, 3 + transpose, 2, 2,
            7, (scaling ? 4 : BEAGLE_OP_NONE), BEAGLE_OP_NONE, 5, 2 + transpose, 3, 3,
            8, (scaling ? 5 : BEAGLE_OP_NONE), BEAGLE_OP_NONE, 6, 1 + transpose, 0, 0,
            9, (scaling ? 6 : BEAGLE_OP_NONE), BEAGLE_OP_NONE, 6, 0 + transpose, 1, 1,
    };

    int rootPreIndex = 5;

    double *patternLogLik = (double*)malloc(sizeof(double) * nPatterns);

    int cumulativeScalingIndex = (scaling ? 2 : BEAGLE_OP_NONE);

    if (scaling) {
        int scalingFactorsCount = 2;
        int scalingFactorsIndices[2] = {0, 1};

        beagleResetScaleFactors(instance,
                                cumulativeScalingIndex);

        beagleAccumulateScaleFactors(instance,
                                     scalingFactorsIndices,
                                     scalingFactorsCount,
                                     cumulativeScalingIndex);
    }

    double logL = 0.0;

    // calculate the site likelihoods at the root node
    beagleCalculateRootLogLikelihoods(instance,               // instance
                                      (const int *)&rootIndex,// bufferIndices
                                      &categoryWeightsIndex,                // weights
                                      &stateFrequencyIndex,                  // stateFrequencies
                                      &cumulativeScalingIndex,// cumulative scaling index
                                      1,                      // count
                                      &logL);         // outLogLikelihoods


    std::vector<double> siteLogLikelihoods(nPatterns);
    beagleGetSiteLogLikelihoods(instance, siteLogLikelihoods.data());

    std::cout << "site-log-like:";
    for (double logLike : siteLogLikelihoods) {
        std::cout << " " << logLike;
    }
    std::cout << std::endl;

    double * seerootPartials = (double*) malloc(sizeof(double) * stateCount * nPatterns * rateCategoryCount);
    int offset = 0;
    for (int c = 0; c < rateCategoryCount; ++c) {
        for (int p = 0; p < nPatterns; ++p) {
            for (int s = 0; s < stateCount; ++s) {
                seerootPartials[offset++] = freqs[s];
            }
        }
    }
    beagleSetPartials(instance, rootPreIndex, seerootPartials);
    fprintf(stdout, "Setting preroot: %d\n", rootPreIndex);

//    beagleSetRootPrePartials(instance, // TODO Remove from API -- not necessary?
//                             (const int *) &rootPreIndex,               // bufferIndices
//                             &stateFrequencyIndex,                  // stateFrequencies
//                             1);                                    // count

    // update the pre-order partials
    beagleUpdatePrePartials(instance,
                            pre_order_operations,
                            4,
                            BEAGLE_OP_NONE);

    fprintf(stdout, "logL = %.5f (R = -18.04619478977292)\n\n", logL);

    int postBufferIndices[4] = {1, 0, 2, 3};
    int preBufferIndices[4] = {8, 9, 7, 6};
    int firstDervIndices[4] = {4 + transpose, 4 + transpose, 4 + transpose, 4 + transpose};
    int secondDervIndices[4] = {5 + transpose, 5 + transpose, 5 + transpose, 5 + transpose};
    int cumulativeScalingInices[4] = {6, 5, 4, 3};
    int categoryRatesIndex = categoryWeightsIndex;
    double* gradient = (double*) malloc(sizeof(double) * nPatterns * 4);
    double* diagonalHessian = (double*) malloc(sizeof(double) * nPatterns * 4);
    
    double * seeprePartials  = (double*) malloc(sizeof(double) * stateCount * nPatterns * rateCategoryCount);
    double * seepostPartials = (double*) malloc(sizeof(double) * stateCount * nPatterns * rateCategoryCount);

    double * tmpNumerator = (double*)   malloc(sizeof(double)  * nPatterns * rateCategoryCount);

    double * grand_denominator = (double*) malloc(sizeof(double)  * nPatterns);
    double * grand_numerator = (double*) malloc(sizeof(double)  * nPatterns);
    /// state frequencies stored in freqs
    /// category weights stored in weights


    beagleGetPartials(instance, rootIndex, BEAGLE_OP_NONE, seerootPartials);
    for(int i = 0; i < 5; i++){
        for(int m = 0; m < nPatterns; m++){
            grand_denominator[m] = 0;
            grand_numerator[m] = 0;
        }
        int postBufferIndex = 4-i;
        int preBufferIndex = 5+i;
        beagleGetPartials(instance, preBufferIndex, BEAGLE_OP_NONE, seeprePartials);
//        beagleGetPartials(instance, postBufferIndex, BEAGLE_OP_NONE, seepostPartials);

//        double * prePartialsPtr = seeprePartials;
//        double * postPartialsPtr = seepostPartials;
//
//        double denominator = 0;
//        double numerator = 0;
//
//        double tmp = 0;
//        int k, j, l, m, s, t;
//        std::cout<<"Gradient for branch (of node) "<< 4 -i <<": \n";
//
//        ///get likelihood for each rate category first
//        double clikelihood[rateCategoryCount * nPatterns];
//        l = 0; j = 0;
//        for(s = 0; s < rateCategoryCount; s++){
//            for(m = 0; m < nPatterns; m++){
//                double clikelihood_tmp = 0.0;
//                for(k=0; k < stateCount; k++){
//                    clikelihood_tmp += freqs[k] * seerootPartials[l++];
//                }
//                clikelihood[j++] = clikelihood_tmp;
//            }
//        }
//
//        ///now calculate weights
//        t = 0;
//        for(s = 0; s < rateCategoryCount; s++){
//            double ws = weights[s];
//            double rs = rates[s];
//            for(m=0; m < nPatterns; m++){
//                l = 0;
//                numerator = 0;
//                denominator = 0;
//                for(k = 0; k < stateCount; k++){
//                    tmp = 0.0;
//                    for(j=0; j < stateCount; j++){
//                        tmp += QT[k * stateCount + j] * prePartialsPtr[j];
//                    }
//                    numerator += tmp * postPartialsPtr[k];
//                    denominator += postPartialsPtr[k] * prePartialsPtr[k];
//                }
//                postPartialsPtr += stateCount;
//                prePartialsPtr  += stateCount;
////                tmpNumerator[t] = ws * rs * numerator / denominator * clikelihood[t];
//                tmpNumerator[t] = ws * rs * numerator;
//                //std::cout<< tmpNumerator[t]<<",  "<<ws*clikelihood[t]<<"  \n";
//                grand_numerator[m] += tmpNumerator[t];
//                grand_denominator[m] += ws * denominator /*clikelihood[t]*/;
//                t++;
//                std::cout<<numerator / denominator <<"  ";
//            }
//            std::cout<<std::endl;
//        }
//
//        for(m=0; m < nPatterns; m++){
//            std::cout<<grand_numerator[m] / grand_denominator[m] << "  ";
//        }
//        std::cout<<std::endl;
//
//        std::cout << "n: ";
//        for(m=0; m < nPatterns; m++){
//            std::cout<<grand_numerator[m] << "  ";
//        }
//        std::cout<<std::endl;
//
//        std::cout << "d: ";
//        for(m=0; m < nPatterns; m++){
//            std::cout<< grand_denominator[m] << "  ";
//        }
//        std::cout<<std::endl;

        std::cout<<"Pre-order Partial for node "<< 4-i << ": \n";

        int l = 0;
        for(int s = 0; s < rateCategoryCount; s++){
            std::cout<<"  rate category"<< s+1<< ": \n";
            for(int k = 0; k<nPatterns; k++){
                for(int j=0; j < stateCount; j++){
                    std::cout<<seeprePartials[l++]<<", ";
                }
                std::cout<<std::endl;
            }
            std::cout<<std::endl;
        }

    }

    std::vector<double> firstBuffer(nPatterns * 4 * 2); // Get both numerator and denominator
    std::vector<double> sumBuffer(4);
    int cumulativeScalingIndices[4] = {BEAGLE_OP_NONE, BEAGLE_OP_NONE, BEAGLE_OP_NONE, BEAGLE_OP_NONE};

    beagleCalculateEdgeDerivatives(instance,
                                   postBufferIndices, preBufferIndices,
                                   firstDervIndices,
                                   &categoryWeightsIndex,
                                   4,
                                   firstBuffer.data(),
                                   sumBuffer.data(),
                                   NULL);

    std::cout << "check gradients  :";
    for (int i = 0; i < 4 * nPatterns; ++i) {
        std::cout << " " << firstBuffer[i];
    }
    std::cout << std::endl;
//    std::cout << "check denominators:";
//    for (int i = 4 * nPatterns; i < 2 * 4 * nPatterns; ++i) {
//        std::cout << " " << firstBuffer[i];
//    }
//    std::cout << std::endl;

    for (int i = 0; i < 4; ++i) {
        double sum = 0.0;
        for (int k = 0; k < nPatterns; ++k) {
            sum += firstBuffer[i * nPatterns + k];
        }
        std::cout << "node " << i << ": " << sum << " ?= " << sumBuffer[i] << std::endl;
    }


    std::cout << "\n\ncheck cross-products  :\n";

    std::vector<double> element(32, 0.0);
    element[0] = element[16 + 0] = -1.0;
    element[1] = element[16 + 1] = 1.0;

    beagleSetTransitionMatrix(instance, 4, element.data(), 0.0);
    beagleSetTransitionMatrix(instance, 5, element.data(), 0.0);

    std::cout << "transpose = " << transpose << "\n";

    beagleCalculateEdgeDerivatives(instance,
                                   postBufferIndices, preBufferIndices,
                                   firstDervIndices,
                                   &categoryWeightsIndex,
                                   4,
                                   firstBuffer.data(),
                                   sumBuffer.data(),
                                   NULL);

    std::cout << "sum buffer for element:";
    double total = 0.0;
    for (int i = 0; i < 4; ++i) {
        total += sumBuffer[i];
        std::cout << " " << sumBuffer[i];
    }
    std::cout << " == " << total << "\n";

    firstBuffer[0] = 0.0;
    firstBuffer[1] = 0.0;

    beagleCalculateCrossProductDerivative(instance,
                                   postBufferIndices, preBufferIndices,
                                   &categoryRatesIndex, &categoryWeightsIndex,
                                          edgeLengths,
                                   4,
                                   firstBuffer.data(), nullptr);

    std::cout << "now: " << firstBuffer[0] << " " << firstBuffer[1] << " ?= " << (firstBuffer[1] - firstBuffer[0]) << std::endl;



//    std::cout






    free(patternWeights);

	free(patternLogLik);
    free(seepostPartials);
    free(seeprePartials);
    free(seerootPartials);
    free(tmpNumerator);
    free(grand_denominator);
    free(grand_numerator);
    free(gradient);
    free(diagonalHessian);
    free(matrix1);
    free(matrix2);

    beagleFinalizeInstance(instance);

#ifdef _WIN32
    std::cout << "\nPress ENTER to exit...\n";
    fflush( stdout);
    fflush( stderr);
    getchar();
#endif

}